

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmopl.c
# Opt level: O0

UINT8 OPLRead(FM_OPL *OPL,UINT8 a)

{
  UINT8 UVar1;
  UINT8 val;
  UINT8 a_local;
  FM_OPL *OPL_local;
  
  if ((a & 1) == 0) {
    if ((OPL->type & 2) == 0) {
      OPL_local._7_1_ = OPL->status & (OPL->statusmask | 0x80);
    }
    else {
      OPL_local._7_1_ = OPL->status & (OPL->statusmask | 0x80) | OPL->deltat->PCM_BSY & 1;
    }
  }
  else {
    switch(OPL->address) {
    case '\x05':
      if ((OPL->type & 4) != 0) {
        if (OPL->keyboardhandler_r != (OPL_PORTHANDLER_R)0x0) {
          UVar1 = (*OPL->keyboardhandler_r)(OPL->keyboard_param);
          return UVar1;
        }
        emu_logf(&OPL->logger,'\x04',"read unmapped KEYBOARD port\n");
      }
      OPL_local._7_1_ = 0;
      break;
    default:
      OPL_local._7_1_ = 0xff;
      break;
    case '\x0f':
      if ((OPL->type & 2) == 0) {
        OPL_local._7_1_ = 0;
      }
      else {
        OPL_local._7_1_ = YM_DELTAT_ADPCM_Read(OPL->deltat);
      }
      break;
    case '\x19':
      if ((OPL->type & 8) != 0) {
        if (OPL->porthandler_r != (OPL_PORTHANDLER_R)0x0) {
          UVar1 = (*OPL->porthandler_r)(OPL->port_param);
          return UVar1;
        }
        emu_logf(&OPL->logger,'\x04',"read unmapped I/O port\n");
      }
      OPL_local._7_1_ = 0;
      break;
    case '\x1a':
      if ((OPL->type & 2) == 0) {
        OPL_local._7_1_ = 0;
      }
      else {
        emu_logf(&OPL->logger,'\x04',"A/D conversion is accessed but not implemented !\n");
        OPL_local._7_1_ = 0x80;
      }
    }
  }
  return OPL_local._7_1_;
}

Assistant:

static UINT8 OPLRead(FM_OPL *OPL,UINT8 a)
{
	if( !(a&1) )
	{
		/* status port */

#if BUILD_Y8950
		if(OPL->type&OPL_TYPE_ADPCM)    /* Y8950 */
		{
			return (OPL->status & (OPL->statusmask|0x80)) | (OPL->deltat->PCM_BSY&1);
		}
#endif

		/* OPL and OPL2 */
		return OPL->status & (OPL->statusmask|0x80);
	}

#if BUILD_Y8950
	/* data port */
	switch(OPL->address)
	{
	case 0x05: /* KeyBoard IN */
		if(OPL->type&OPL_TYPE_KEYBOARD)
		{
			if(OPL->keyboardhandler_r)
				return OPL->keyboardhandler_r(OPL->keyboard_param);
			else
				emu_logf(&OPL->logger, DEVLOG_DEBUG, "read unmapped KEYBOARD port\n");
		}
		return 0;

	case 0x0f: /* ADPCM-DATA  */
		if(OPL->type&OPL_TYPE_ADPCM)
		{
			UINT8 val;

			val = YM_DELTAT_ADPCM_Read(OPL->deltat);
			/*emu_logf(&OPL->logger, DEVLOG_DEBUG, "read ADPCM value read=%02x\n",val);*/
			return val;
		}
		return 0;

	case 0x19: /* I/O DATA    */
		if(OPL->type&OPL_TYPE_IO)
		{
			if(OPL->porthandler_r)
				return OPL->porthandler_r(OPL->port_param);
			else
				emu_logf(&OPL->logger, DEVLOG_DEBUG, "read unmapped I/O port\n");
		}
		return 0;
	case 0x1a: /* PCM-DATA    */
		if(OPL->type&OPL_TYPE_ADPCM)
		{
			emu_logf(&OPL->logger, DEVLOG_DEBUG, "A/D conversion is accessed but not implemented !\n");
			return 0x80; /* 2's complement PCM data - result from A/D conversion */
		}
		return 0;
	}
#endif

	return 0xff;
}